

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O0

void __thiscall hbm::streaming::StreamClient::stop(StreamClient *this)

{
  SocketNonblocking *in_RDI;
  
  SocketNonblocking::stop(in_RDI);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  timeInfo::clear((timeInfo *)(in_RDI[1].m_bufferedReader.m_buffer + 0x90));
  return;
}

Assistant:

void StreamClient::stop()
		{
			m_streamSocket.stop();
			m_address.clear();
			m_streamId.clear();
			m_controlPort.clear();
			m_initialTime.clear();
		}